

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcols.c
# Opt level: O0

int ffgcdw(fitsfile *fptr,int colnum,int *width,int *status)

{
  int iVar1;
  int iVar2;
  ushort **ppuVar3;
  int *in_RCX;
  int *in_RDX;
  uint in_ESI;
  int *in_RDI;
  bool bVar4;
  int gstatus;
  long rwidth;
  long repeat;
  int typecode;
  double tscale;
  int scaled;
  int tstatus;
  int hdutype;
  int tcode;
  char dispfmt [20];
  char keyname [75];
  char message [81];
  char *cptr;
  tcolumn *colptr;
  int *in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec1;
  undefined1 in_stack_fffffffffffffec2;
  undefined1 in_stack_fffffffffffffec3;
  undefined4 in_stack_fffffffffffffec4;
  fitsfile *in_stack_fffffffffffffec8;
  long lVar5;
  long lVar6;
  int *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  int iVar7;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 uVar8;
  int local_110;
  int *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  double *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  fitsfile *in_stack_ffffffffffffff18;
  int *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff34;
  fitsfile *in_stack_ffffffffffffff38;
  char local_98 [96];
  char *local_38;
  long local_30;
  int *local_28;
  int *local_20;
  uint local_14;
  int *local_10;
  int local_4;
  
  if (*in_RCX < 1) {
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff20);
    }
    if (((int)local_14 < 1) || (*(int *)(*(long *)(local_10 + 2) + 0x3b0) < (int)local_14)) {
      snprintf(local_98,0x51,"Specified column number is out of range: %d",(ulong)local_14);
      ffpmsg((char *)0x1c0b4e);
      *local_28 = 0x12e;
      local_4 = 0x12e;
    }
    else {
      local_30 = *(long *)(*(long *)(local_10 + 2) + 0x3d0) + (long)(int)(local_14 - 1) * 0xa0;
      iVar2 = *(int *)(local_30 + 0x50);
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      ffkeyn((char *)in_stack_fffffffffffffef8,iVar2,
             (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             (int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      *local_20 = 0;
      uVar8 = 0;
      iVar1 = ffgkys(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                     (char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                     in_stack_fffffffffffffef8);
      if (iVar1 == 0) {
        for (local_38 = &stack0xfffffffffffffef8; *local_38 == ' '; local_38 = local_38 + 1) {
        }
        if ((((((*local_38 == 'A') || (*local_38 == 'a')) || (*local_38 == 'I')) ||
             (((*local_38 == 'i' || (*local_38 == 'O')) ||
              ((*local_38 == 'o' || ((*local_38 == 'Z' || (*local_38 == 'z')))))))) ||
            (*local_38 == 'F')) ||
           ((((*local_38 == 'f' || (*local_38 == 'E')) || (*local_38 == 'e')) ||
            (((*local_38 == 'D' || (*local_38 == 'd')) || ((*local_38 == 'G' || (*local_38 == 'g')))
             ))))) {
          while( true ) {
            ppuVar3 = __ctype_b_loc();
            in_stack_fffffffffffffec3 = false;
            if (((*ppuVar3)[(int)*local_38] & 0x800) == 0) {
              in_stack_fffffffffffffec3 = *local_38 != '\0';
            }
            if ((bool)in_stack_fffffffffffffec3 == false) break;
            local_38 = local_38 + 1;
          }
          iVar1 = atoi(local_38);
          *local_20 = iVar1;
          if (0x52 < iVar2) {
            *local_20 = *local_20 * 2 + 3;
          }
        }
      }
      if (*local_20 == 0) {
        ffkeyn((char *)in_stack_fffffffffffffef8,iVar2,
               (char *)CONCAT44(uVar8,in_stack_fffffffffffffee8),
               (int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        ffgkys(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08
               ,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        ffkeyn((char *)in_stack_fffffffffffffef8,iVar2,
               (char *)CONCAT44(uVar8,in_stack_fffffffffffffee8),
               (int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        uVar8 = 0;
        iVar7 = 0;
        iVar1 = ffgkyd(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08
                       ,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        if ((iVar1 == 0) &&
           (((double)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0) != 1.0 ||
            (NAN((double)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)))))) {
          iVar7 = 1;
        }
        if ((iVar7 == 0) || (0x15 < iVar2)) {
          if ((iVar7 == 0) || (iVar2 != 0x29)) {
            if ((iVar7 == 0) || (iVar2 != 0x51)) {
              ffghdt(in_stack_fffffffffffffec8,
                     (int *)CONCAT44(in_stack_fffffffffffffec4,
                                     CONCAT13(in_stack_fffffffffffffec3,
                                              CONCAT12(in_stack_fffffffffffffec2,
                                                       CONCAT11(in_stack_fffffffffffffec1,
                                                                in_stack_fffffffffffffec0)))),
                     in_stack_fffffffffffffeb8);
              if (local_110 == 1) {
                local_38 = &stack0xfffffffffffffef8;
                while( true ) {
                  ppuVar3 = __ctype_b_loc();
                  bVar4 = false;
                  if (((*ppuVar3)[(int)*local_38] & 0x800) == 0) {
                    bVar4 = *local_38 != '\0';
                  }
                  if (!bVar4) break;
                  local_38 = local_38 + 1;
                }
                iVar2 = atoi(local_38);
                *local_20 = iVar2;
              }
              else if (iVar2 == 1) {
                *local_20 = 8;
              }
              else if (iVar2 == 0xb) {
                *local_20 = 4;
              }
              else if (iVar2 == 0x15) {
                *local_20 = 6;
              }
              else if (iVar2 == 0x29) {
                *local_20 = 0xb;
              }
              else if (iVar2 == 0x51) {
                *local_20 = 0x14;
              }
              else if (iVar2 == 0x2a) {
                *local_20 = 0xe;
              }
              else if (iVar2 == 0x52) {
                *local_20 = 0x17;
              }
              else if (iVar2 == 0x53) {
                *local_20 = 0x1f;
              }
              else if (iVar2 == 0xa3) {
                *local_20 = 0x31;
              }
              else if (iVar2 == 0xe) {
                *local_20 = 1;
              }
              else if (iVar2 == 0x10) {
                lVar6 = 0;
                lVar5 = 0;
                iVar2 = ffgtcl((fitsfile *)CONCAT44(uVar8,iVar7),in_stack_fffffffffffffee4,
                               in_stack_fffffffffffffed8,(long *)0x0,(long *)0x0,
                               (int *)(ulong)CONCAT13(in_stack_fffffffffffffec3,
                                                      CONCAT12(in_stack_fffffffffffffec2,
                                                               CONCAT11(in_stack_fffffffffffffec1,
                                                                        in_stack_fffffffffffffec0)))
                              );
                if (((iVar2 == 0) && (0 < lVar5)) && (lVar5 < lVar6)) {
                  *local_20 = (int)lVar5;
                }
                else {
                  local_38 = &stack0xfffffffffffffef8;
                  while( true ) {
                    ppuVar3 = __ctype_b_loc();
                    bVar4 = false;
                    if (((*ppuVar3)[(int)*local_38] & 0x800) == 0) {
                      bVar4 = *local_38 != '\0';
                    }
                    if (!bVar4) break;
                    local_38 = local_38 + 1;
                  }
                  iVar2 = atoi(local_38);
                  *local_20 = iVar2;
                }
                if (*local_20 < 1) {
                  *local_20 = 1;
                }
              }
            }
            else {
              *local_20 = 0x17;
            }
          }
          else {
            *local_20 = 0x17;
          }
        }
        else {
          *local_20 = 0xe;
        }
      }
      local_4 = *local_28;
    }
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffgcdw( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column (1 = 1st col)      */
            int  *width,      /* O - display width                       */
            int  *status)     /* IO - error status                           */
/*
  Get Column Display Width.
*/
{
    tcolumn *colptr;
    char *cptr;
    char message[FLEN_ERRMSG], keyname[FLEN_KEYWORD], dispfmt[20];
    int tcode, hdutype, tstatus, scaled;
    double tscale;

    if (*status > 0)  /* inherit input status value if > 0 */
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
    {
        snprintf(message, FLEN_ERRMSG,"Specified column number is out of range: %d",
                colnum);
        ffpmsg(message);
        return(*status = BAD_COL_NUM);
    }

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */
    tcode = abs(colptr->tdatatype);

    /* use the TDISPn keyword if it exists */
    ffkeyn("TDISP", colnum, keyname, status);

    *width = 0;
    tstatus = 0;
    if (ffgkys(fptr, keyname, dispfmt, NULL, &tstatus) == 0)
    {
          /* parse TDISPn get the display width */
          cptr = dispfmt;
          while(*cptr == ' ') /* skip leading blanks */
              cptr++;

          if (*cptr == 'A' || *cptr == 'a' ||
              *cptr == 'I' || *cptr == 'i' ||
              *cptr == 'O' || *cptr == 'o' ||
              *cptr == 'Z' || *cptr == 'z' ||
              *cptr == 'F' || *cptr == 'f' ||
              *cptr == 'E' || *cptr == 'e' ||
              *cptr == 'D' || *cptr == 'd' ||
              *cptr == 'G' || *cptr == 'g')
          {

            while(!isdigit((int) *cptr) && *cptr != '\0') /* find 1st digit */
              cptr++;

            *width = atoi(cptr);
            if (tcode >= TCOMPLEX)
              *width = (2 * (*width)) + 3;
          }
    }

    if (*width == 0)
    {
        /* no valid TDISPn keyword; use TFORMn instead */

        ffkeyn("TFORM", colnum, keyname, status);
        ffgkys(fptr, keyname, dispfmt, NULL, status);

        /* check if  column is scaled */
        ffkeyn("TSCAL", colnum, keyname, status);
        tstatus = 0;
        scaled = 0;

        if (ffgkyd(fptr, keyname, &tscale, NULL, &tstatus) == 0)
        {
            if (tscale != 1.0)
                scaled = 1;    /* yes, this is a scaled column */
        }

        if (scaled && tcode <= TSHORT)
        {
            /* scaled short integer col == float; default format is 14.6G */
            *width = 14;
        }
        else if (scaled && tcode == TLONG)
        {
            /* scaled long integer col == double; default format is 23.15G */
            *width = 23;
        }
        else if (scaled && tcode == TLONGLONG)
        {
            /* scaled long long integer col == double; default format is 23.15G */
            *width = 23;
        }

        else
        {
           ffghdt(fptr, &hdutype, status);  /* get type of table */
           if (hdutype == ASCII_TBL)
           {
              /* parse TFORMn get the display width */
              cptr = dispfmt;
              while(!isdigit((int) *cptr) && *cptr != '\0') /* find 1st digit */
                 cptr++;

              *width = atoi(cptr);
           }
           else
           {
                 /* this is a binary table */
                  if (tcode == TBIT)           /* 'X' */
                     *width = 8;
                  else if (tcode == TBYTE)     /* 'B' */
                     *width = 4;
                  else if (tcode == TSHORT)    /* 'I' */
                     *width = 6;
                  else if (tcode == TLONG)     /* 'J' */
                     *width = 11;
                  else if (tcode == TLONGLONG) /* 'K' */
                     *width = 20;
                  else if (tcode == TFLOAT)    /* 'E' */
                     *width = 14;
                  else if (tcode == TDOUBLE)   /* 'D' */
                     *width = 23;
                  else if (tcode == TCOMPLEX)  /* 'C' */
                     *width = 31;
                  else if (tcode == TDBLCOMPLEX)  /* 'M' */
                     *width = 49;
                  else if (tcode == TLOGICAL)  /* 'L' */
                     *width = 1;
                  else if (tcode == TSTRING)   /* 'A' */
                  {
		    int typecode;
		    long int repeat = 0, rwidth = 0;
		    int gstatus = 0;

		    /* Deal with possible vector string with repeat / width  by parsing
		       the TFORM=rAw keyword */
		    if (ffgtcl(fptr, colnum, &typecode, &repeat, &rwidth, &gstatus) == 0 &&
			rwidth >= 1 && rwidth < repeat) {
		      *width = rwidth;

		    } else {
		      
		      /* Hmmm, we couldn't parse the TFORM keyword by standard, so just do
			 simple parsing */
		      cptr = dispfmt;
		      while(!isdigit((int) *cptr) && *cptr != '\0') 
			cptr++;
		      
		      *width = atoi(cptr);
		    }

                    if (*width < 1)
                         *width = 1;  /* default is at least 1 column */
                  }
            }
        }
    } 
    return(*status);
}